

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::ExecuteCommand(cmMakefile *this,cmListFileFunction *lff,cmExecutionStatus *status)

{
  cmDebugger *pcVar1;
  bool bVar2;
  int iVar3;
  cmCommand *pcVar4;
  undefined4 extraout_var;
  cmake *pcVar5;
  cmListFileContext *pcVar6;
  char *__rhs;
  byte bVar7;
  cmMakefileCall stack_manager;
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string name;
  
  bVar2 = IsFunctionBlocked(this,lff,status);
  if (bVar2) {
    return true;
  }
  std::__cxx11::string::string((string *)&name,(string *)lff);
  cmMakefileCall::cmMakefileCall(&stack_manager,this,&lff->super_cmCommandContext,status);
  pcVar4 = cmState::GetCommand(this->GlobalGenerator->CMakeInstance->State,&name);
  if (pcVar4 == (cmCommand *)0x0) {
    bVar2 = cmSystemTools::GetFatalErrorOccured();
    bVar7 = 1;
    if (!bVar2) {
      std::__cxx11::string::string
                ((string *)&error,"Unknown CMake command \"",(allocator *)&local_70);
      std::__cxx11::string::append((string *)&error);
      std::__cxx11::string::append((char *)&error);
      IssueMessage(this,FATAL_ERROR,&error);
      cmSystemTools::s_FatalErrorOccured = true;
      std::__cxx11::string::~string((string *)&error);
      bVar7 = 0;
    }
  }
  else {
    iVar3 = (*pcVar4->_vptr_cmCommand[6])(pcVar4);
    pcVar4 = (cmCommand *)CONCAT44(extraout_var,iVar3);
    pcVar4->Makefile = this;
    bVar2 = cmSystemTools::GetFatalErrorOccured();
    bVar7 = 1;
    if (!bVar2) {
      pcVar5 = this->GlobalGenerator->CMakeInstance;
      if (pcVar5->Trace == true) {
        PrintCommandTrace(this,lff);
        pcVar5 = this->GlobalGenerator->CMakeInstance;
      }
      pcVar1 = pcVar5->Debugger;
      if (pcVar1 != (cmDebugger *)0x0) {
        pcVar6 = cmListFileBacktrace::Top(&this->Backtrace);
        (*pcVar1->_vptr_cmDebugger[0xc])(pcVar1,pcVar6,lff);
      }
      iVar3 = (*pcVar4->_vptr_cmCommand[2])(pcVar4,&lff->Arguments,status);
      bVar7 = (byte)iVar3 ^ 1 | status->NestedError;
      if (bVar7 == 1) {
        if (status->NestedError == false) {
          std::operator+(&local_70,&name," ");
          __rhs = cmCommand::GetError(pcVar4);
          std::operator+(&error,&local_70,__rhs);
          std::__cxx11::string::~string((string *)&local_70);
          IssueMessage(this,FATAL_ERROR,&error);
          std::__cxx11::string::~string((string *)&error);
        }
        if (this->GlobalGenerator->CMakeInstance->CurrentWorkingMode != NORMAL_MODE) {
          cmSystemTools::s_FatalErrorOccured = true;
        }
      }
      else {
        iVar3 = (*pcVar4->_vptr_cmCommand[5])(pcVar4);
        if ((char)iVar3 != '\0') {
          error._M_dataplus._M_p = (pointer)pcVar4;
          std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
                    ((vector<cmCommand*,std::allocator<cmCommand*>> *)&this->FinalPassCommands,
                     (cmCommand **)&error);
          pcVar4 = (cmCommand *)0x0;
        }
      }
      bVar2 = cmSystemTools::GetFatalErrorOccured();
      if ((bVar2) &&
         (pcVar1 = this->GlobalGenerator->CMakeInstance->Debugger, pcVar1 != (cmDebugger *)0x0)) {
        pcVar6 = cmListFileBacktrace::Top(&this->Backtrace);
        (*pcVar1->_vptr_cmDebugger[0xd])(pcVar1,pcVar6);
      }
      bVar7 = bVar7 ^ 1;
      if (pcVar4 == (cmCommand *)0x0) goto LAB_00374381;
    }
    (*pcVar4->_vptr_cmCommand[1])(pcVar4);
  }
LAB_00374381:
  cmMakefileCall::~cmMakefileCall(&stack_manager);
  std::__cxx11::string::~string((string *)&name);
  return (bool)bVar7;
}

Assistant:

bool cmMakefile::ExecuteCommand(const cmListFileFunction& lff,
                                cmExecutionStatus& status)
{
  bool result = true;

  // quick return if blocked
  if (this->IsFunctionBlocked(lff, status)) {
    // No error.
    return result;
  }

  std::string name = lff.Name;

  // Place this call on the call stack.
  cmMakefileCall stack_manager(this, lff, status);
  static_cast<void>(stack_manager);

  // Lookup the command prototype.
  if (cmCommand* proto = this->GetState()->GetCommand(name)) {
    // Clone the prototype.
    CM_AUTO_PTR<cmCommand> pcmd(proto->Clone());
    pcmd->SetMakefile(this);

    // Decide whether to invoke the command.
    if (!cmSystemTools::GetFatalErrorOccured()) {
      // if trace is enabled, print out invoke information
      if (this->GetCMakeInstance()->GetTrace()) {
        this->PrintCommandTrace(lff);
      }

      if (auto debugger = this->GetCMakeInstance()->GetDebugger()) {
        debugger->PreRunHook(this->Backtrace.Top(), lff);
      }

      // Try invoking the command.
      bool invokeSucceeded = pcmd->InvokeInitialPass(lff.Arguments, status);
      bool hadNestedError = status.GetNestedError();
      if (!invokeSucceeded || hadNestedError) {
        if (!hadNestedError) {
          // The command invocation requested that we report an error.
          std::string const error = name + " " + pcmd->GetError();
          this->IssueMessage(cmake::FATAL_ERROR, error);
        }
        result = false;
        if (this->GetCMakeInstance()->GetWorkingMode() != cmake::NORMAL_MODE) {
          cmSystemTools::SetFatalErrorOccured();
        }
      } else if (pcmd->HasFinalPass()) {
        // use the command
        this->FinalPassCommands.push_back(pcmd.release());
      }

      // If this is true here, it means the command set the fatal error flag;
      // alert the debugger
      if (cmSystemTools::GetFatalErrorOccured()) {
        if (auto debugger = this->GetCMakeInstance()->GetDebugger()) {
          debugger->ErrorHook(this->Backtrace.Top());
        }
      }
    }
  } else {
    if (!cmSystemTools::GetFatalErrorOccured()) {
      std::string error = "Unknown CMake command \"";
      error += lff.Name;
      error += "\".";
      this->IssueMessage(cmake::FATAL_ERROR, error);
      result = false;
      cmSystemTools::SetFatalErrorOccured();
    }
  }

  return result;
}